

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  byte ch;
  bool bVar1;
  CharFormat CVar2;
  size_t index;
  size_t sVar3;
  
  std::operator<<(os,"\"");
  bVar1 = false;
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    ch = begin[sVar3];
    if (bVar1) {
      bVar1 = IsXDigit(ch);
      if (bVar1) {
        std::operator<<(os,"\" \"");
      }
    }
    CVar2 = PrintAsWideStringLiteralTo((uint)ch,os);
    bVar1 = CVar2 == kHexEscape;
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const char cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" \"";
    }
    is_previous_hex = PrintAsNarrowStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}